

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

BBox3fa * __thiscall
embree::avx2::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,size_t i)

{
  undefined4 uVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  pcVar6 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
  uVar5 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  sVar7 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
  lVar12 = uVar5 * sVar7;
  lVar13 = (uVar5 + 1) * sVar7;
  uVar1 = *(undefined4 *)(pcVar6 + lVar12);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(pcVar6 + lVar12 + 4);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  fVar2 = *(float *)(pcVar6 + lVar12 + 8);
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  fVar8 = (space->vz).field_0.m128[0];
  fVar9 = (space->vz).field_0.m128[1];
  fVar10 = (space->vz).field_0.m128[2];
  fVar11 = (space->vz).field_0.m128[3];
  auVar18._0_4_ = fVar2 * fVar8;
  auVar18._4_4_ = fVar2 * fVar9;
  auVar18._8_4_ = fVar2 * fVar10;
  auVar18._12_4_ = fVar2 * fVar11;
  auVar17 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar4,auVar17);
  auVar17 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar3,auVar14);
  uVar1 = *(undefined4 *)(pcVar6 + lVar12 + 0xc);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar17 = vblendps_avx(auVar17,auVar15,8);
  uVar1 = *(undefined4 *)(pcVar6 + lVar13);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(pcVar6 + lVar13 + 4);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  fVar2 = *(float *)(pcVar6 + lVar13 + 8);
  auVar21._0_4_ = fVar2 * fVar8;
  auVar21._4_4_ = fVar2 * fVar9;
  auVar21._8_4_ = fVar2 * fVar10;
  auVar21._12_4_ = fVar2 * fVar11;
  auVar14 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar4,auVar22);
  auVar14 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar19);
  uVar1 = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar14 = vblendps_avx(auVar14,auVar20,8);
  auVar18 = vminps_avx(auVar17,auVar14);
  auVar17 = vmaxps_avx(auVar17,auVar14);
  auVar14 = vmaxss_avx(auVar20,auVar15);
  fVar2 = auVar14._0_4_ * (this->super_LineSegments).maxRadiusScale;
  auVar16._4_4_ = fVar2;
  auVar16._0_4_ = fVar2;
  auVar16._8_4_ = fVar2;
  auVar16._12_4_ = fVar2;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar18,auVar16);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar17._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar17._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar17._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar17._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }